

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNDepartureSet<unsigned_char> * __thiscall
Centaurus::CompositeATN<unsigned_char>::build_departure_set
          (CATNDepartureSet<unsigned_char> *__return_storage_ptr__,CompositeATN<unsigned_char> *this
          ,CATNClosure *closure)

{
  bool bVar1;
  int color;
  reference this_00;
  ATNPath *path;
  PriorityChain *priority;
  CATNClosureElement *p;
  iterator __end2;
  iterator __begin2;
  CATNClosure *__range2;
  undefined1 local_60 [8];
  ATNStateStack stack;
  CATNDepartureSetFactory<unsigned_char> deptset_factory;
  CATNClosure *closure_local;
  CompositeATN<unsigned_char> *this_local;
  
  CATNDepartureSetFactory<unsigned_char>::CATNDepartureSetFactory
            ((CATNDepartureSetFactory<unsigned_char> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ATNPath::ATNPath((ATNPath *)local_60);
  __end2 = std::
           set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           ::begin(closure);
  p = (CATNClosureElement *)
      std::
      set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::end(closure);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&p);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator*(&__end2);
    path = CATNClosureElement::path(this_00);
    color = CATNClosureElement::color(this_00);
    priority = CATNClosureElement::priority(this_00);
    build_departure_set_r
              (this,(CATNDepartureSetFactory<unsigned_char> *)
                    &stack.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,path,color,priority,
               (ATNStateStack *)local_60);
    std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++(&__end2);
  }
  CATNDepartureSetFactory<unsigned_char>::build_departure_set
            (__return_storage_ptr__,
             (CATNDepartureSetFactory<unsigned_char> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ATNPath::~ATNPath((ATNPath *)local_60);
  CATNDepartureSetFactory<unsigned_char>::~CATNDepartureSetFactory
            ((CATNDepartureSetFactory<unsigned_char> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set(const CATNClosure& closure) const
    {
        CATNDepartureSetFactory<TCHAR> deptset_factory;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_departure_set_r(deptset_factory, p.path(), p.color(), p.priority(), stack);
        }

        return deptset_factory.build_departure_set();
    }